

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context.hpp
# Opt level: O1

void __thiscall
asio::io_context::basic_executor_type<std::allocator<void>,_0UL>::
execute<asio::detail::executor_function>
          (basic_executor_type<std::allocator<void>,_0UL> *this,executor_function *f)

{
  ulong uVar1;
  long *plVar2;
  impl_base *piVar3;
  undefined8 uVar4;
  ptr local_30;
  
  uVar1 = this->target_;
  if ((uVar1 & 1) == 0) {
    plVar2 = (long *)__tls_get_addr(&PTR_0057ce40);
    plVar2 = (long *)*plVar2;
    if (plVar2 != (long *)0x0) {
      do {
        if (*plVar2 == *(long *)((uVar1 & 0xfffffffffffffffc) + 8)) {
          if (plVar2[1] != 0) {
            piVar3 = f->impl_;
            f->impl_ = (impl_base *)0x0;
            if (piVar3 != (impl_base *)0x0) {
              (*piVar3->complete_)(piVar3,true);
              piVar3 = (impl_base *)0x0;
            }
            if (piVar3 == (impl_base *)0x0) {
              return;
            }
            (*piVar3->complete_)(piVar3,false);
            return;
          }
          break;
        }
        plVar2 = (long *)plVar2[2];
      } while (plVar2 != (long *)0x0);
    }
  }
  local_30.a = (allocator<void> *)this;
  plVar2 = (long *)__tls_get_addr(&PTR_0057ce40);
  if (*plVar2 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = *(undefined8 *)(*plVar2 + 8);
  }
  local_30.v = detail::thread_info_base::allocate<asio::detail::thread_info_base::default_tag>
                         (uVar4,0x28,8);
  (((executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
     *)local_30.v)->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
  (((executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
     *)local_30.v)->super_scheduler_operation).func_ =
       detail::
       executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
       ::do_complete;
  (((executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
     *)local_30.v)->super_scheduler_operation).task_result_ = 0;
  (((executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
     *)local_30.v)->handler_).impl_ = f->impl_;
  f->impl_ = (impl_base *)0x0;
  local_30.p = (executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
                *)local_30.v;
  detail::scheduler::post_immediate_completion
            (*(scheduler **)((this->target_ & 0xfffffffffffffffc) + 8),(operation *)local_30.v,
             SUB41(((uint)this->target_ & 2) >> 1,0));
  local_30.v = (void *)0x0;
  local_30.p = (executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
                *)0x0;
  detail::
  executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
  ::ptr::reset(&local_30);
  return;
}

Assistant:

void io_context::basic_executor_type<Allocator, Bits>::execute(
    Function&& f) const
{
  typedef decay_t<Function> function_type;

  // Invoke immediately if the blocking.possibly property is enabled and we are
  // already inside the thread pool.
  if ((bits() & blocking_never) == 0 && context_ptr()->impl_.can_dispatch())
  {
    // Make a local, non-const copy of the function.
    function_type tmp(static_cast<Function&&>(f));

#if !defined(ASIO_NO_EXCEPTIONS)
    try
    {
#endif // !defined(ASIO_NO_EXCEPTIONS)
      detail::fenced_block b(detail::fenced_block::full);
      static_cast<function_type&&>(tmp)();
      return;
#if !defined(ASIO_NO_EXCEPTIONS)
    }
    catch (...)
    {
      context_ptr()->impl_.capture_current_exception();
      return;
    }
#endif // !defined(ASIO_NO_EXCEPTIONS)
  }

  // Allocate and construct an operation to wrap the function.
  typedef detail::executor_op<function_type, Allocator, detail::operation> op;
  typename op::ptr p = {
      detail::addressof(static_cast<const Allocator&>(*this)),
      op::ptr::allocate(static_cast<const Allocator&>(*this)), 0 };
  p.p = new (p.v) op(static_cast<Function&&>(f),
      static_cast<const Allocator&>(*this));

  ASIO_HANDLER_CREATION((*context_ptr(), *p.p,
        "io_context", context_ptr(), 0, "execute"));

  context_ptr()->impl_.post_immediate_completion(p.p,
      (bits() & relationship_continuation) != 0);
  p.v = p.p = 0;
}